

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

global_object_create_result *
mjs::make_string_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  undefined8 uVar2;
  slot *psVar3;
  global_object_create_result *pgVar4;
  void *pvVar5;
  long *plVar6;
  function_object *pfVar7;
  void *pvVar8;
  long *plVar9;
  anon_class_8_1_54a39808_for_f f;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::gc_function> p_7;
  gc_heap_ptr<mjs::function_object> o_9;
  gc_heap_ptr<mjs::gc_function> p_3;
  value p;
  anon_class_24_3_e06c2290 make_string_function;
  gc_heap_ptr<mjs::string_object> prototype;
  anon_class_32_2_842af841 check_type;
  gc_heap_ptr<mjs::function_object> c;
  slot local_198;
  uint32_t local_190;
  slot local_188;
  uint32_t local_180;
  undefined1 local_178 [16];
  slot local_168;
  char *local_160;
  slot local_158;
  uint32_t local_150;
  undefined1 local_148 [8];
  undefined1 local_140 [8];
  slot local_138;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true> local_130;
  undefined1 local_128 [40];
  gc_heap *local_100;
  undefined1 local_f8 [16];
  slot *local_e8;
  string_view local_e0;
  slot local_d0;
  uint32_t local_c8;
  undefined1 local_c0 [16];
  gc_heap_ptr_untyped local_b0;
  gc_heap_ptr_untyped local_98;
  global_object_create_result *local_88;
  gc_heap_ptr_untyped local_80;
  gc_heap_ptr_untyped local_70;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  string_view local_40;
  
  local_88 = __return_storage_ptr__;
  pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  local_100 = *(gc_heap **)((long)pvVar5 + 8);
  local_c0._0_8_ = (gc_heap *)0x6;
  local_c0._8_8_ = (long)"toISOString" + 5;
  string::string((string *)local_128,local_100,(string_view *)local_c0);
  plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar6 + 0x58))(local_148,plVar6);
  local_178._0_8_ = (gc_heap *)0x0;
  local_178._8_8_ = "";
  string::string((string *)local_f8,local_100,(string_view *)local_178);
  pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  local_188.representation._0_1_ = 1 < *(int *)((long)pvVar5 + 0x20);
  gc_heap::
  allocate_and_construct<mjs::string_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,mjs::string,bool>
            ((gc_heap *)&local_d0.allocation,(size_t)local_100,(string *)0x30,
             (gc_heap_ptr<mjs::object> *)local_128,(string *)local_148,(bool *)local_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_d0.allocation);
  object::class_name((object *)local_148);
  make_raw_function((mjs *)&local_98,global);
  pfVar7 = (function_object *)gc_heap_ptr_untyped::get(&local_98);
  local_c0._0_8_ = (gc_heap *)0x0;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffff00000000;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_128,(size_t)(pfVar7->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_128);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da3d8;
  *(gc_heap **)((long)pvVar5 + 0x10) = local_100;
  function_object::put_function
            (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_128,
             (gc_heap_ptr<mjs::gc_string> *)local_148,(gc_heap_ptr<mjs::gc_string> *)local_c0,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
  local_178._0_8_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_178._8_4_ = (global->super_gc_heap_ptr_untyped).pos_;
  if ((gc_heap *)local_178._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_178._0_8_,(gc_heap_ptr_untyped *)local_178);
  }
  pvVar5 = gc_heap_ptr_untyped::get(&local_98);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_128,*(size_t *)((long)pvVar5 + 8));
  pvVar8 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_128);
  *(undefined ***)((long)pvVar8 + 8) = &PTR_destroy_001da418;
  *(undefined8 *)((long)pvVar8 + 0x10) = local_178._0_8_;
  *(undefined4 *)((long)pvVar8 + 0x18) = local_178._8_4_;
  if ((gc_heap *)local_178._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_178._0_8_,(gc_heap_ptr_untyped *)((long)pvVar8 + 0x10));
  }
  if ((*(int *)((long)pvVar5 + 0x28) == 0) && (CONCAT44(local_128._4_4_,local_128._0_4_) != 0)) {
    *(undefined4 *)((long)pvVar5 + 0x28) = local_128._8_4_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
    pvVar5 = gc_heap_ptr_untyped::get(&local_98);
    value_representation::get_value
              ((value *)local_128,(value_representation *)((long)pvVar5 + 0x38),
               *(gc_heap **)((long)pvVar5 + 8));
    if (local_128._0_4_ != object) {
      __assert_fail("p.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                    ,0x59,
                    "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:121:35)]"
                   );
    }
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar5 + 0x20) < 1) {
      if (local_128._0_4_ != object) {
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_128 + 8));
      plVar9 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar9 + 0x98))(local_148,plVar9,"constructor");
      local_f8._0_8_ = local_98.heap_;
      local_f8._8_4_ = local_98.pos_;
      if (local_98.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)local_f8);
      }
      local_c0._0_4_ = 5;
      local_c0._8_8_ = local_f8._0_8_;
      local_b0.heap_ = (gc_heap *)CONCAT44(local_b0.heap_._4_4_,local_f8._8_4_);
      if ((gc_heap *)local_f8._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_f8._0_8_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,local_148,local_c0,2);
      value::destroy((value *)local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    }
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_d0.allocation);
    plVar9 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar9 + 0x98))(local_c0,plVar9,"constructor");
    local_148 = (undefined1  [8])local_98.heap_;
    local_140._0_4_ = local_98.pos_;
    if (local_98.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)local_148);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_148;
    local_128._16_4_ = local_140._0_4_;
    if (local_148 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,local_c0,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
    local_188.representation = (uint64_t)local_98.heap_;
    local_180 = local_98.pos_;
    if (local_98.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_168.representation = 0xc;
    local_160 = "fromCharCode";
    string::string((string *)&local_198.allocation,local_100,(string_view *)&local_168.allocation);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_188.allocation);
    make_raw_function((mjs *)local_178,global);
    pfVar7 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
    local_148 = (undefined1  [8])0x0;
    local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_c0,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da458;
    *(gc_heap **)((long)pvVar5 + 0x10) = local_100;
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_c0,
               (gc_heap_ptr<mjs::gc_string> *)&local_198.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_148,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    local_f8._0_8_ = local_178._0_8_;
    local_f8._8_4_ = local_178._8_4_;
    if ((gc_heap *)local_178._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_178._0_8_,(gc_heap_ptr_untyped *)local_f8);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_f8._0_8_;
    local_128._16_4_ = local_f8._8_4_;
    if ((gc_heap *)local_f8._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f8._0_8_,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_198,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    local_c0._0_8_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_c0._8_4_ = (global->super_gc_heap_ptr_untyped).pos_;
    if ((gc_heap *)local_c0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,(gc_heap_ptr_untyped *)local_c0);
    }
    local_b0.heap_ = (gc_heap *)local_d0;
    local_b0.pos_ = local_c8;
    if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_d0,&local_b0);
    }
    local_168.representation = local_d0.representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,local_c8);
    if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_d0,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar6 + 0x98))(&local_158,plVar6,"toString");
    local_148 = (undefined1  [8])local_c0._0_8_;
    local_140._0_4_ = local_c0._8_4_;
    if ((gc_heap *)local_c0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,(gc_heap_ptr_untyped *)local_148);
    }
    local_138.representation = (uint64_t)local_b0.heap_;
    local_130.pos_ = local_b0.pos_;
    if (local_b0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b0.heap_,(gc_heap_ptr_untyped *)&local_138.allocation);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,global);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_f8,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da498;
    *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
    *(undefined4 *)((long)pvVar5 + 0x18) = local_140._0_4_;
    if (local_148 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
    }
    ((slot *)((long)pvVar5 + 0x20))->representation = (uint64_t)local_138;
    *(uint32_t *)((long)pvVar5 + 0x28) = local_130.pos_;
    if ((gc_heap *)local_138.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_138,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
    }
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_f8,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_138.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    local_168.representation = local_d0.representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,local_c8);
    if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_d0,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar6 + 0x98))(&local_158,plVar6,"valueOf");
    local_148 = (undefined1  [8])local_c0._0_8_;
    local_140._0_4_ = local_c0._8_4_;
    if ((gc_heap *)local_c0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,(gc_heap_ptr_untyped *)local_148);
    }
    local_138.representation = (uint64_t)local_b0.heap_;
    local_130.pos_ = local_b0.pos_;
    if (local_b0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b0.heap_,(gc_heap_ptr_untyped *)&local_138.allocation);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,global);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_f8,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da4d8;
    *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
    *(undefined4 *)((long)pvVar5 + 0x18) = local_140._0_4_;
    if (local_148 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
    }
    ((slot *)((long)pvVar5 + 0x20))->representation = (uint64_t)local_138;
    *(uint32_t *)((long)pvVar5 + 0x28) = local_130.pos_;
    if ((gc_heap *)local_138.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_138,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
    }
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_f8,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_138.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    local_f8._0_8_ = local_100;
    local_e8 = &local_d0;
    local_168.representation = local_d0.representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,local_c8);
    local_f8._8_8_ = global;
    if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_d0,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    local_e0._M_len = 6;
    local_e0._M_str = "charAt";
    string::string((string *)&local_158.allocation,local_100,&local_e0);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,global);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da058;
    *(gc_heap **)((long)pvVar5 + 0x10) = local_100;
    *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    local_168.representation = local_d0.representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,local_c8);
    if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_d0,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    uVar1 = local_f8._0_8_;
    local_e0._M_len = 10;
    local_e0._M_str = "charCodeAt";
    string::string((string *)&local_158.allocation,(gc_heap *)local_f8._0_8_,&local_e0);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,global);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da098;
    *(undefined8 *)((long)pvVar5 + 0x10) = uVar1;
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    psVar3 = local_e8;
    uVar2 = local_f8._8_8_;
    local_168.allocation = (slot_allocation_header)local_e8->representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,local_e8[1].new_position);
    if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    local_e0._M_len = 7;
    local_e0._M_str = "indexOf";
    string::string((string *)&local_158.allocation,(gc_heap *)uVar1,&local_e0);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,(gc_heap_ptr<mjs::global_object> *)uVar2);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da0d8;
    *(undefined8 *)((long)pvVar5 + 0x10) = uVar1;
    *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    local_168.allocation = (slot_allocation_header)psVar3->representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,psVar3[1].new_position);
    if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    uVar1 = local_f8._0_8_;
    local_e0._M_len = 0xb;
    local_e0._M_str = "lastIndexOf";
    string::string((string *)&local_158.allocation,(gc_heap *)local_f8._0_8_,&local_e0);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,(gc_heap_ptr<mjs::global_object> *)uVar2);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da118;
    *(undefined8 *)((long)pvVar5 + 0x10) = uVar1;
    *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    local_50.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_50.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_50.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_50.heap_,&local_50);
    }
    psVar3 = local_e8;
    uVar2 = local_f8._8_8_;
    local_158.representation = local_e8->representation;
    local_150 = local_e8[1].new_position;
    if ((gc_heap *)local_158.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_158,(gc_heap_ptr_untyped *)&local_158.allocation);
    }
    local_40._M_len = 5;
    local_40._M_str = "split";
    string::string((string *)&local_e0,(gc_heap *)uVar1,&local_40);
    local_148 = (undefined1  [8])local_f8._0_8_;
    local_140 = (undefined1  [8])local_50.heap_;
    local_138.new_position = local_50.pos_;
    if (local_50.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_50.heap_,(gc_heap_ptr_untyped *)local_140);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_158.allocation);
    make_raw_function((mjs *)&local_168.allocation,(gc_heap_ptr<mjs::global_object> *)uVar2);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    local_188.representation = 0;
    local_180 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_178,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da158;
    *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
    *(undefined1 (*) [8])((long)pvVar5 + 0x18) = local_140;
    *(uint32_t *)((long)pvVar5 + 0x20) = local_138.new_position;
    if (local_140 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_140,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_178,
               (gc_heap_ptr<mjs::gc_string> *)&local_e0,
               (gc_heap_ptr<mjs::gc_string> *)&local_188.allocation,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    local_198.representation = local_168.representation;
    local_190 = (uint32_t)local_160;
    if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_198.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_198;
    local_128._16_4_ = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar6 + 8))(plVar6,&local_e0,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
    local_168.allocation = (slot_allocation_header)psVar3->representation;
    local_160 = (char *)CONCAT44(local_160._4_4_,psVar3[1].new_position);
    if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_168.allocation);
    }
    uVar1 = local_f8._0_8_;
    local_e0._M_len = 9;
    local_e0._M_str = "substring";
    string::string((string *)&local_158.allocation,(gc_heap *)local_f8._0_8_,&local_e0);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
    make_raw_function((mjs *)&local_198.allocation,(gc_heap_ptr<mjs::global_object> *)uVar2);
    pfVar7 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
    local_178._0_8_ = (gc_heap *)0x0;
    local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da198;
    *(undefined8 *)((long)pvVar5 + 0x10) = uVar1;
    *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
               (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
               (gc_heap_ptr<mjs::gc_string> *)local_178,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
    local_188.representation = local_198.representation;
    local_180 = local_190;
    if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_188;
    local_128._16_4_ = local_180;
    if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    f.h = (gc_heap *)0x2;
    (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)local_f8,"toLowerCase",(int)local_100,f);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)local_f8,"toUpperCase",(int)local_100,f);
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (0 < *(int *)((long)pvVar5 + 0x20)) {
      make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
                ((__0 *)local_f8,"toLocaleLowerCase",(int)local_100,f);
      make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
                ((__0 *)local_f8,"toLocaleUpperCase",(int)local_100,f);
      psVar3 = local_e8;
      uVar1 = local_f8._8_8_;
      local_168.allocation = (slot_allocation_header)local_e8->representation;
      local_160 = (char *)CONCAT44(local_160._4_4_,local_e8[1].new_position);
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_168.allocation);
      }
      uVar2 = local_f8._0_8_;
      local_e0._M_len = 0xd;
      local_e0._M_str = "localeCompare";
      string::string((string *)&local_158.allocation,(gc_heap *)local_f8._0_8_,&local_e0);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      make_raw_function((mjs *)&local_198.allocation,(gc_heap_ptr<mjs::global_object> *)uVar1);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
      local_178._0_8_ = (gc_heap *)0x0;
      local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da258;
      *(undefined8 *)((long)pvVar5 + 0x10) = uVar2;
      *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
                 (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
                 (gc_heap_ptr<mjs::gc_string> *)local_178,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      local_188.representation = local_198.representation;
      local_180 = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_188;
      local_128._16_4_ = local_180;
      if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      local_168.allocation = (slot_allocation_header)psVar3->representation;
      local_160 = (char *)CONCAT44(local_160._4_4_,psVar3[1].new_position);
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_168.allocation);
      }
      local_e0._M_len = 6;
      local_e0._M_str = "concat";
      string::string((string *)&local_158.allocation,(gc_heap *)uVar2,&local_e0);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      make_raw_function((mjs *)&local_198.allocation,(gc_heap_ptr<mjs::global_object> *)uVar1);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
      local_178._0_8_ = (gc_heap *)0x0;
      local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da298;
      *(undefined8 *)((long)pvVar5 + 0x10) = uVar2;
      *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
                 (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
                 (gc_heap_ptr<mjs::gc_string> *)local_178,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      local_188.representation = local_198.representation;
      local_180 = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_188;
      local_128._16_4_ = local_180;
      if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      uVar1 = local_f8._8_8_;
      local_168.allocation = (slot_allocation_header)local_e8->representation;
      local_160 = (char *)CONCAT44(local_160._4_4_,local_e8[1].new_position);
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_168.allocation);
      }
      uVar2 = local_f8._0_8_;
      local_e0._M_len = 5;
      local_e0._M_str = "slice";
      string::string((string *)&local_158.allocation,(gc_heap *)local_f8._0_8_,&local_e0);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      make_raw_function((mjs *)&local_198.allocation,(gc_heap_ptr<mjs::global_object> *)uVar1);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_198.allocation);
      local_178._0_8_ = (gc_heap *)0x0;
      local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_148,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da2d8;
      *(undefined8 *)((long)pvVar5 + 0x10) = uVar2;
      *(gc_heap **)((long)pvVar5 + 0x18) = local_100;
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_148,
                 (gc_heap_ptr<mjs::gc_string> *)&local_158.allocation,
                 (gc_heap_ptr<mjs::gc_string> *)local_178,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      local_188.representation = local_198.representation;
      local_180 = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)&local_188.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_188;
      local_128._16_4_ = local_180;
      if ((gc_heap *)local_188.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_188,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_158,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      local_60.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_60.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_60.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_60.heap_,&local_60);
      }
      uVar1 = local_f8._8_8_;
      local_158.allocation = (slot_allocation_header)local_e8->representation;
      local_150 = local_e8[1].new_position;
      if ((gc_heap *)local_158.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_158,(gc_heap_ptr_untyped *)&local_158.allocation);
      }
      local_40._M_len = 5;
      local_40._M_str = "match";
      string::string((string *)&local_e0,(gc_heap *)uVar2,&local_40);
      local_148 = (undefined1  [8])local_f8._0_8_;
      local_140 = (undefined1  [8])local_60.heap_;
      local_138.new_position = local_60.pos_;
      if (local_60.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_60.heap_,(gc_heap_ptr_untyped *)local_140);
      }
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_158.allocation);
      make_raw_function((mjs *)&local_168.allocation,(gc_heap_ptr<mjs::global_object> *)uVar1);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      local_188.representation = 0;
      local_180 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_178,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da318;
      *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
      *(undefined1 (*) [8])((long)pvVar5 + 0x18) = local_140;
      *(uint32_t *)((long)pvVar5 + 0x20) = local_138.new_position;
      if (local_140 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_140,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
      }
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_178,
                 (gc_heap_ptr<mjs::gc_string> *)&local_e0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_188.allocation,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      local_198.representation = local_168.representation;
      local_190 = (uint32_t)local_160;
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_198.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_198;
      local_128._16_4_ = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_e0,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
      local_70.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_70.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_70.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_70.heap_,&local_70);
      }
      uVar1 = local_f8._8_8_;
      local_158.allocation = (slot_allocation_header)local_e8->representation;
      local_150 = local_e8[1].new_position;
      if ((gc_heap *)local_158.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_158,(gc_heap_ptr_untyped *)&local_158.allocation);
      }
      uVar2 = local_f8._0_8_;
      local_40._M_len = 6;
      local_40._M_str = "search";
      string::string((string *)&local_e0,(gc_heap *)local_f8._0_8_,&local_40);
      local_148 = (undefined1  [8])uVar2;
      local_140 = (undefined1  [8])local_70.heap_;
      local_138.new_position = local_70.pos_;
      if (local_70.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)local_140);
      }
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_158.allocation);
      make_raw_function((mjs *)&local_168.allocation,(gc_heap_ptr<mjs::global_object> *)uVar1);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      local_188.representation = 0;
      local_180 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_178,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da358;
      *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
      *(undefined1 (*) [8])((long)pvVar5 + 0x18) = local_140;
      *(uint32_t *)((long)pvVar5 + 0x20) = local_138.new_position;
      if (local_140 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_140,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
      }
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_178,
                 (gc_heap_ptr<mjs::gc_string> *)&local_e0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_188.allocation,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      local_198.representation = local_168.representation;
      local_190 = (uint32_t)local_160;
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_198.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_198;
      local_128._16_4_ = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_e0,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      local_80.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_80.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_80.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_80.heap_,&local_80);
      }
      uVar1 = local_f8._8_8_;
      local_158 = (slot)local_e8->representation;
      local_150 = local_e8[1].new_position;
      if ((gc_heap *)local_158.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_158,(gc_heap_ptr_untyped *)&local_158.allocation);
      }
      uVar2 = local_f8._0_8_;
      local_40._M_len = 7;
      local_40._M_str = "replace";
      string::string((string *)&local_e0,(gc_heap *)local_f8._0_8_,&local_40);
      local_148 = (undefined1  [8])uVar2;
      local_140 = (undefined1  [8])local_80.heap_;
      local_138.new_position = local_80.pos_;
      if (local_80.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)local_140);
      }
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_158.allocation);
      make_raw_function((mjs *)&local_168.allocation,(gc_heap_ptr<mjs::global_object> *)uVar1);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      local_188.representation = 0;
      local_180 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_178,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da398;
      *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
      *(undefined1 (*) [8])((long)pvVar5 + 0x18) = local_140;
      *(uint32_t *)((long)pvVar5 + 0x20) = local_138.new_position;
      if (local_140 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_140,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
      }
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_178,
                 (gc_heap_ptr<mjs::gc_string> *)&local_e0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_188.allocation,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      local_198.representation = local_168.representation;
      local_190 = (uint32_t)local_160;
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_198.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_198;
      local_128._16_4_ = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_e0,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
    }
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (1 < *(int *)((long)pvVar5 + 0x20)) {
      local_158.representation = local_d0.representation;
      local_150 = local_c8;
      if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_d0,(gc_heap_ptr_untyped *)&local_158.allocation);
      }
      local_40._M_len = 4;
      local_40._M_str = "trim";
      string::string((string *)&local_e0,local_100,&local_40);
      local_148 = (undefined1  [8])(global->super_gc_heap_ptr_untyped).heap_;
      local_140._0_4_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_148 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)local_148);
      }
      pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      local_138.new_position = *(uint32_t *)((long)pvVar5 + 0x20);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_158.allocation);
      make_raw_function((mjs *)&local_168.allocation,global);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      local_188.representation = 0;
      local_180 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_178,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da518;
      *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
      *(undefined4 *)((long)pvVar5 + 0x18) = local_140._0_4_;
      if (local_148 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      *(uint32_t *)((long)pvVar5 + 0x20) = local_138.new_position;
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_178,
                 (gc_heap_ptr<mjs::gc_string> *)&local_e0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_188.allocation,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      local_198.representation = local_168.representation;
      local_190 = (uint32_t)local_160;
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_198.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_198;
      local_128._16_4_ = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_e0,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
      local_158.representation = local_d0.representation;
      local_150 = local_c8;
      if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_d0,(gc_heap_ptr_untyped *)&local_158.allocation);
      }
      local_40._M_len = 6;
      local_40._M_str = "substr";
      string::string((string *)&local_e0,local_100,&local_40);
      local_148 = (undefined1  [8])(global->super_gc_heap_ptr_untyped).heap_;
      local_140._0_4_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_148 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)local_148);
      }
      pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      local_138.new_position = *(uint32_t *)((long)pvVar5 + 0x20);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_158.allocation);
      make_raw_function((mjs *)&local_168.allocation,global);
      pfVar7 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168.allocation);
      local_188.representation = 0;
      local_180 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_178,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_178);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da558;
      *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_148;
      *(undefined4 *)((long)pvVar5 + 0x18) = local_140._0_4_;
      if (local_148 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_148,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      *(uint32_t *)((long)pvVar5 + 0x20) = local_138.new_position;
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_178,
                 (gc_heap_ptr<mjs::gc_string> *)&local_e0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_188.allocation,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188.allocation);
      local_198.representation = local_168.representation;
      local_190 = (uint32_t)local_160;
      if ((gc_heap *)local_168.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_168,(gc_heap_ptr_untyped *)&local_198.allocation);
      }
      local_128._0_4_ = object;
      local_128._8_8_ = local_198;
      local_128._16_4_ = local_190;
      if ((gc_heap *)local_198.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_198,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar6 + 8))(plVar6,&local_e0,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_158.allocation);
    }
    (local_88->obj).super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    (local_88->obj).super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if (local_98.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)local_88);
    }
    pgVar4 = local_88;
    (local_88->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_d0;
    (local_88->prototype).super_gc_heap_ptr_untyped.pos_ = local_c8;
    if ((gc_heap *)local_d0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_d0,&(local_88->prototype).super_gc_heap_ptr_untyped);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d0.allocation);
    return pgVar4;
  }
  __assert_fail("!construct_ && f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x45,
                "void mjs::function_object::construct_function(const gc_heap_ptr<gc_function> &)");
}

Assistant:

global_object_create_result make_string_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global->heap();
    auto prototype = h.make<string_object>(string{h, "String"}, global->object_prototype(), string{h, ""}, global->language_version() >= version::es5);

    auto c = make_function(global, [&h](const value&, const std::vector<value>& args) {
        return value{args.empty() ? string{h, ""} : to_string(h, args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [global](const value&, const std::vector<value>& args) {
        auto& h = global->heap();
        return value{new_string(global, args.empty() ? string{h, ""} : to_string(h, args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    put_native_function(global, c, string{h, "fromCharCode"}, [&h](const value&, const std::vector<value>& args){
        std::wstring s;
        for (const auto& a: args) {
            s.push_back(to_uint16(a));
        }
        return value{string{h, s}};
    }, 0);

    auto check_type = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "String");
    };

    put_native_function(global, prototype, global->common_string("toString"), [check_type](const value& this_, const std::vector<value>&){
        check_type(this_);
        return value{static_cast<const string_object&>(*this_.object_value()).string_value()};
    }, 0);
    put_native_function(global, prototype, global->common_string("valueOf"), [check_type](const value& this_, const std::vector<value>&){
        check_type(this_);
        return value{static_cast<const string_object&>(*this_.object_value()).string_value()};
    }, 0);


    auto make_string_function = [&](const char* name, int num_args, auto f) {
        put_native_function(global, prototype, string{h, name}, [&h, f](const value& this_, const std::vector<value>& args){
            return value{f(to_string(h, this_), args)};
        }, num_args);
    };

    make_string_function("charAt", 1, [&h](const string& s, const std::vector<value>& args){
        const int position = to_int32(get_arg(args, 0));
        if (position < 0 || position >= static_cast<int>(s.view().length())) {
            return string{h, ""};
        }
        return string{h, s.view().substr(position, 1)};
    });

    make_string_function("charCodeAt", 1, [](const string& s, const std::vector<value>& args){
        const int position = to_int32(get_arg(args, 0));
        if (position < 0 || position >= static_cast<int>(s.view().length())) {
            return static_cast<double>(NAN);
        }
        return static_cast<double>(s.view()[position]);
    });

    make_string_function("indexOf", 2, [&h](const string& s, const std::vector<value>& args){
        const auto& search_string = to_string(h, get_arg(args, 0));
        const int position = to_int32(get_arg(args, 1));
        auto index = s.view().find(search_string.view(), position);
        return index == std::wstring_view::npos ? -1. : static_cast<double>(index);
    });

    make_string_function("lastIndexOf", 2, [&h](const string& s, const std::vector<value>& args){
        const auto& search_string = to_string(h, get_arg(args, 0));
        double position = to_number(get_arg(args, 1));
        const int ipos = std::isnan(position) ? INT_MAX : to_int32(position);
        auto index = s.view().rfind(search_string.view(), ipos);
        return index == std::wstring_view::npos ? -1. : static_cast<double>(index);
    });

    make_string_function("split", 1, [global](const string& str, const std::vector<value>& args){
        const auto s = str.view();
        auto& h = global->heap();
        auto a = make_array(global, 0);
        if (args.empty()) {
            a->put(string{h, index_string(0)}, value{string{h, s}});
        } else {
            const auto sep = to_string(h, args.front());
            if (sep.view().empty()) {
                for (uint32_t i = 0; i < s.length(); ++i) {
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(i,1) }});
                }
            } else {
                size_t pos = 0;
                uint32_t i = 0;
                for (; pos < s.length(); ++i) {
                    const auto next_pos = s.find(sep.view(), pos);
                    if (next_pos == std::wstring_view::npos) {
                        break;
                    }
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(pos, next_pos-pos) }});
                    pos = next_pos + 1;
                }
                if (pos < s.length()) {
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(pos) }});
                }
            }
        }
        return a;
    });

    make_string_function("substring", 1, [&h](const string& str, const std::vector<value>& args) {
        const auto s = str.view();
        int start = std::min(std::max(to_int32(get_arg(args, 0)), 0), static_cast<int>(s.length()));
        if (args.size() < 2) {
            return string{h, s.substr(start)};
        }
        int end = std::min(std::max(to_int32(get_arg(args, 1)), 0), static_cast<int>(s.length()));
        if (start > end) {
            std::swap(start, end);
        }
        return string{h, s.substr(start, end-start)};
    });

    auto to_lower = [&h](const string& s, const std::vector<value>&){
        std::wstring res;
        for (auto c: s.view()) {
            res.push_back(towlower(c));
        }
        return string{h, res};
    };

    auto to_upper = [&h](const string& s, const std::vector<value>&){
        std::wstring res;
        for (auto c: s.view()) {
            res.push_back(towupper(c));
        }
        return string{h, res};
    };

    make_string_function("toLowerCase", 0, to_lower);
    make_string_function("toUpperCase", 0, to_upper);

    if (global->language_version() >= version::es3) {
        make_string_function("toLocaleLowerCase", 0, to_lower);
        make_string_function("toLocaleUpperCase", 0, to_upper);
        make_string_function("localeCompare", 1, [&h](const string& s, const std::vector<value>& args){
            const auto res = s.view().compare(to_string(h, get_arg(args, 0)).view());
            return value{ static_cast<double>(res < 0 ? 1 : res > 0 ? -1 : 0) };
        });
        make_string_function("concat", 1, [&h](const string& s, const std::vector<value>& args) {
            std::wstring res{s.view()};
            for (const auto& a: args) {
                res += to_string(h, a).view();
            }
            return value{string{h, res}};
        });
        make_string_function("slice", 2, [&h](const string& str, const std::vector<value>& args) {
            const auto s = str.view();
            const auto l = static_cast<uint32_t>(s.length());
            const auto ns = to_integer(get_arg(args, 0));
            const auto& end_arg = get_arg(args, 1);
            const auto ne = end_arg.type() == value_type::undefined ? l : to_integer(end_arg);
            const auto start = static_cast<uint32_t>(ns < 0 ? std::max(l + ns, 0.0) : std::min(ns, 0.0+l));
            const auto end   = static_cast<uint32_t>(ne < 0 ? std::max(l + ne, 0.0) : std::min(ne, 0.0+l));
            return value{string{h, s.substr(start, start < end ? end - start : 0)}};
        });
        make_string_function("match", 1, [global](const string& s, const std::vector<value>& args) {
            return string_match(global, s, get_arg(args, 0));
        });
        make_string_function("search", 1, [global](const string& s, const std::vector<value>& args) {
            return string_search(global, s, get_arg(args, 0));
        });
        make_string_function("replace", 2, [global](const string& s, const std::vector<value>& args) {
            return string_replace(global, s, get_arg(args, 0), get_arg(args, 1));
        });
    }
    if (global->language_version() >= version::es5) {
        put_native_function(global, prototype, string{h, "trim"}, [global, ver = global->language_version()](const value& this_, const std::vector<value>&) {
            // CheckObjectCoercible
            if (this_.type() == value_type::undefined || this_.type() == value_type::null) {
                std::ostringstream oss;
                oss << "String.prototype.trim cannot be called on " << this_.type();
                throw native_error_exception(native_error_type::type, global->stack_trace(), oss.str());
            }
            auto& h = global->heap();
            auto s = to_string(h, this_);
            return value{string{h, trim(s.view(), ver)}};
        }, 0);

        put_native_function(global, prototype, string{h, "substr"}, [global, ver = global->language_version()](const value& this_, const std::vector<value>& args) {
            // ES5.1, B.2.3
            auto& h = global.heap();
            // 1
            const auto str = to_string(h, this_);
            // 2
            auto start  = to_integer(args.size() >= 1 ? args[0] : value::undefined);
            // 3
            auto length = args.size() < 2 || args[1].type() == value_type::undefined ? +INFINITY : to_integer(args[1]);
            // 4
            const auto str_len = str.view().length();
            // 5
            if (start < 0) start = std::max(str_len + start, 0.);
            // 6
            length = std::min(std::max(length, 0.), str_len - start);
            // 7
            if (length <= 0) return value{string{h, ""}};
            // 8
            return value{string{h, str.view().substr(static_cast<size_t>(start), static_cast<size_t>(length))}};
        }, 2);
    }

    return {c, prototype};
}